

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChTriangleMeshConnected::RefineMeshEdges
          (ChTriangleMeshConnected *this,vector<int,_std::allocator<int>_> *marked_tris,
          double edge_maxlen,ChRefineEdgeCriterion *criterion,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *atri_map,
          vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
          *aux_data_double,
          vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
          *aux_data_int,
          vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
          *aux_data_bool,
          vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
          *aux_data_vect)

{
  undefined4 uVar1;
  int *piVar2;
  pointer pCVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  _List_node_base *p_Var10;
  ChTriangleMeshConnected *this_00;
  ulong uVar11;
  pair<int,_int> pVar12;
  long lVar13;
  ChException *this_01;
  ulong uVar14;
  int itB;
  ulong uVar15;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int itA_2;
  int itA_1;
  vector<int,_std::allocator<int>_> new_marked_tris;
  int local_11c;
  int itB_2;
  int itB_1;
  double local_110;
  list<int,_std::allocator<int>_> mlist;
  int local_ec;
  vector<bool,_std::allocator<bool>_> marked_tris_flagged;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> tmp_tri_map;
  list<int,_std::allocator<int>_> S;
  double local_68;
  string local_50;
  
  std::__cxx11::list<int,std::allocator<int>>::
  list<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((list<int,std::allocator<int>> *)&S,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&marked_tris_flagged);
  tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (atri_map == (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x0) {
    ComputeNeighbouringTriangleMap(this,&tmp_tri_map);
  }
  else {
    std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::operator=
              (&tmp_tri_map,atri_map);
  }
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::resize
            (&marked_tris_flagged,
             ((long)(this->m_face_v_indices).
                    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_face_v_indices).
                    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,false);
  piVar2 = (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar9 = (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar9 != piVar2; piVar9 = piVar9 + 1) {
    uVar15 = (ulong)*piVar9;
    uVar11 = uVar15 + 0x3f;
    if (-1 < (long)uVar15) {
      uVar11 = uVar15;
    }
    marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p
    [((long)uVar11 >> 6) + ((ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
         marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
         [((long)uVar11 >> 6) + ((ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
         1L << (uVar15 & 0x3f);
  }
  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var10 = S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
            _M_next;
  if (S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next !=
      (_List_node_base *)&S) {
    do {
      uVar1 = *(undefined4 *)&p_Var10[1]._M_next;
      mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
      mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_next = (_List_node_base *)&mlist;
      mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_prev = (_List_node_base *)&mlist;
      this_00 = (ChTriangleMeshConnected *)::operator_new(0x18);
      *(undefined4 *)
       &(this_00->m_vertices).
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = uVar1;
      std::__detail::_List_node_base::_M_hook((_List_node_base *)this_00);
      mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
           mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 1;
      if (mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
          _M_next != (_List_node_base *)&mlist) {
        do {
          iVar8 = *(int *)&mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                           super__List_node_base._M_prev[1]._M_next;
          uVar11 = (ulong)iVar8;
          lVar16 = 0;
          local_110 = 0.0;
          local_11c = 0;
          itB = 0;
          do {
            pVar12 = GetTriangleEdgeIndexes
                               (this_00,(this->m_face_v_indices).
                                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar11,
                                (int)lVar16,true);
            iVar6 = pVar12.first;
            if (criterion == (ChRefineEdgeCriterion *)0x0) {
              lVar13 = (long)pVar12 >> 0x20;
              pCVar3 = (this->m_vertices).
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar17 = pCVar3[iVar6].m_data[1] - pCVar3[lVar13].m_data[1];
              auVar18._8_8_ = 0;
              auVar18._0_8_ = dVar17 * dVar17;
              auVar22._8_8_ = 0;
              auVar22._0_8_ = pCVar3[iVar6].m_data[0] - pCVar3[lVar13].m_data[0];
              auVar18 = vfmadd231sd_fma(auVar18,auVar22,auVar22);
              auVar20._8_8_ = 0;
              auVar20._0_8_ = pCVar3[iVar6].m_data[2] - pCVar3[lVar13].m_data[2];
              auVar18 = vfmadd231sd_fma(auVar18,auVar20,auVar20);
              if (auVar18._0_8_ < 0.0) {
                dVar17 = sqrt(auVar18._0_8_);
              }
              else {
                auVar18 = vsqrtsd_avx(auVar18,auVar18);
                dVar17 = auVar18._0_8_;
              }
            }
            else {
              this_00 = (ChTriangleMeshConnected *)criterion;
              dVar17 = (double)(**(code **)(*(long *)criterion + 0x10))
                                         (criterion,(ulong)pVar12 & 0xffffffff,(ulong)pVar12 >> 0x20
                                          ,this);
            }
            if (local_110 < dVar17) {
              itB = *(int *)((long)(tmp_tri_map.
                                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                            lVar16 * 4 + (uVar11 << 4 | 4));
              local_11c = (int)lVar16;
              local_110 = dVar17;
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          if (local_110 < edge_maxlen) {
LAB_0082983f:
            this_00 = (ChTriangleMeshConnected *)
                      mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                      super__List_node_base._M_prev;
            mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                 mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(this_00,0x18);
          }
          else {
            this_00 = (ChTriangleMeshConnected *)::operator_new(0x18);
            *(int *)&(this_00->m_vertices).
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish = itB;
            std::__detail::_List_node_base::_M_hook((_List_node_base *)this_00);
            mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                 mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 1;
            if (1000 < mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size) {
              this_01 = (ChException *)__cxa_allocate_exception(0x28);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"overflow in ChTriangleMeshConnected::RefineMeshEdges",
                         "");
              ChException::ChException(this_01,&local_50);
              __cxa_throw(this_01,&ChException::typeinfo,ChException::~ChException);
            }
            if (itB == -1) {
              if ((edge_maxlen < local_110) &&
                 (SplitEdge(this,iVar8,-1,local_11c,0,&itA_1,&itA_2,&itB_1,&itB_2,&tmp_tri_map,
                            aux_data_double,aux_data_int,aux_data_bool,aux_data_vect),
                 uVar11 < (ulong)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>.
                                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base
                                 ._M_offset +
                          ((long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>.
                                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base
                                 ._M_p -
                          (long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                _M_p) * 8)) {
                uVar15 = uVar11 + 0x3f;
                if (-1 < (long)uVar11) {
                  uVar15 = uVar11;
                }
                if ((marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)uVar15 >> 6) +
                      ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                     (uVar11 & 0x3f) & 1) != 0) {
                  if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&new_marked_tris,
                               (iterator)
                               new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish,&itA_1);
                  }
                  else {
                    *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = itA_1;
                    new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  iVar8 = itA_2;
                  if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&new_marked_tris,
                               (iterator)
                               new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish,&itA_2);
                  }
                  else {
LAB_00829804:
                    *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = iVar8;
                    new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
              }
LAB_00829820:
              p_Var5 = mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                       super__List_node_base._M_prev;
              mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                   mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(p_Var5,0x18);
              goto LAB_0082983f;
            }
            uVar15 = (ulong)itB;
            local_68 = 0.0;
            lVar16 = 0;
            iVar6 = 0;
            local_ec = 0;
            do {
              pVar12 = GetTriangleEdgeIndexes
                                 (this_00,(this->m_face_v_indices).
                                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar15,
                                  (int)lVar16,true);
              iVar7 = pVar12.first;
              if (criterion == (ChRefineEdgeCriterion *)0x0) {
                lVar13 = (long)pVar12 >> 0x20;
                pCVar3 = (this->m_vertices).
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar17 = pCVar3[iVar7].m_data[1] - pCVar3[lVar13].m_data[1];
                auVar19._8_8_ = 0;
                auVar19._0_8_ = dVar17 * dVar17;
                auVar23._8_8_ = 0;
                auVar23._0_8_ = pCVar3[iVar7].m_data[0] - pCVar3[lVar13].m_data[0];
                auVar18 = vfmadd231sd_fma(auVar19,auVar23,auVar23);
                auVar21._8_8_ = 0;
                auVar21._0_8_ = pCVar3[iVar7].m_data[2] - pCVar3[lVar13].m_data[2];
                auVar18 = vfmadd231sd_fma(auVar18,auVar21,auVar21);
                if (auVar18._0_8_ < 0.0) {
                  dVar17 = sqrt(auVar18._0_8_);
                }
                else {
                  auVar18 = vsqrtsd_avx(auVar18,auVar18);
                  dVar17 = auVar18._0_8_;
                }
              }
              else {
                this_00 = (ChTriangleMeshConnected *)criterion;
                dVar17 = (double)(**(code **)(*(long *)criterion + 0x10))
                                           (criterion,(ulong)pVar12 & 0xffffffff,
                                            (ulong)pVar12 >> 0x20,this);
              }
              if (local_68 < dVar17) {
                iVar6 = *(int *)((long)(tmp_tri_map.
                                        super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                lVar16 * 4 + (uVar15 << 4 | 4));
                local_ec = (int)lVar16;
                local_68 = dVar17;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            if (iVar6 == iVar8) {
              if (edge_maxlen < local_110) {
                SplitEdge(this,iVar8,itB,local_11c,local_ec,&itA_1,&itA_2,&itB_1,&itB_2,&tmp_tri_map
                          ,aux_data_double,aux_data_int,aux_data_bool,aux_data_vect);
                if (uVar11 < (ulong)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_finish.
                                    super__Bit_iterator_base._M_offset +
                             ((long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_finish.
                                    super__Bit_iterator_base._M_p -
                             (long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data._M_start.
                                   super__Bit_iterator_base._M_p) * 8) {
                  uVar14 = uVar11 + 0x3f;
                  if (-1 < (long)uVar11) {
                    uVar14 = uVar11;
                  }
                  if ((marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar14 >> 6) +
                        ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar11 & 0x3f) & 1) != 0) {
                    if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&new_marked_tris,
                                 (iterator)
                                 new_marked_tris.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&itA_1);
                    }
                    else {
                      *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = itA_1;
                      new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&new_marked_tris,
                                 (iterator)
                                 new_marked_tris.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&itA_2);
                    }
                    else {
                      *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = itA_2;
                      new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                }
                if (uVar15 < (ulong)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_finish.
                                    super__Bit_iterator_base._M_offset +
                             ((long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_finish.
                                    super__Bit_iterator_base._M_p -
                             (long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data._M_start.
                                   super__Bit_iterator_base._M_p) * 8) {
                  uVar11 = uVar15 + 0x3f;
                  if (-1 < (long)uVar15) {
                    uVar11 = uVar15;
                  }
                  if ((marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar11 >> 6) +
                        ((ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar15 & 0x3f) & 1) != 0) {
                    if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&new_marked_tris,
                                 (iterator)
                                 new_marked_tris.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&itB_1);
                    }
                    else {
                      *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = itB_1;
                      new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    iVar8 = itB_2;
                    if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish !=
                        new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) goto LAB_00829804;
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&new_marked_tris,
                               (iterator)
                               new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish,&itB_2);
                  }
                }
              }
              goto LAB_00829820;
            }
          }
        } while ((edge_maxlen <= local_110) &&
                (mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next != (_List_node_base *)&mlist));
      }
      p_Var5 = mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
               super__List_node_base._M_next;
      while (p_Var5 != (_List_node_base *)&mlist) {
        p_Var4 = (((_List_base<int,_std::allocator<int>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
                 super__List_node_base._M_next;
        operator_delete(p_Var5,0x18);
        p_Var5 = p_Var4;
      }
      p_Var10 = (((_List_base<int,_std::allocator<int>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
                super__List_node_base._M_next;
    } while (p_Var10 != (_List_node_base *)&S);
  }
  std::vector<int,_std::allocator<int>_>::operator=(marked_tris,&new_marked_tris);
  if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tmp_tri_map.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tmp_tri_map.
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tmp_tri_map.
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  while (S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
         != (_List_node_base *)&S) {
    p_Var10 = (((_List_base<int,_std::allocator<int>_> *)
               &(S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base
                ._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_next,0x18);
    S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
         p_Var10;
  }
  return;
}

Assistant:

void ChTriangleMeshConnected::RefineMeshEdges(
    std::vector<int>&
        marked_tris,     ///< triangles to refine (aso surrounding triangles might be affected by refinements)
    double edge_maxlen,  ///< maximum length of edge (small values give higher resolution)
    ChRefineEdgeCriterion* criterion,  ///< criterion for computing lenght (or other merit function) of edge, if =0 uses
                                       ///< default (euclidean length)
    std::vector<std::array<int, 4>>* atri_map,  ///< triangle connectivity map: use and modify it. Optional. If =0,
                                                ///< creates a temporary one just for life span of function.
    std::vector<std::vector<double>*>& aux_data_double,  ///< auxiliary buffers to refine (assuming indexed as vertexes:
                                                         ///< each with same size as vertex buffer)
    std::vector<std::vector<int>*>& aux_data_int,  ///< auxiliary buffers to refine (assuming indexed as vertexes: each
                                                   ///< with same size as vertex buffer)
    std::vector<std::vector<bool>*>& aux_data_bool,  ///< auxiliary buffers to refine (assuming indexed as vertexes:
                                                     ///< each with same size as vertex buffer)
    std::vector<std::vector<ChVector<>>*>& aux_data_vect  ///< auxiliary buffers to refine (assuming indexed as
                                                          ///< vertexes: each with same size as vertex buffer)
) {
    // initialize the list of triangles to refine, copying from marked triangles:
    std::list<int> S(marked_tris.begin(), marked_tris.end());

    // compute the connectivity map between triangles:
    std::vector<std::array<int, 4>> tmp_tri_map;
    std::vector<std::array<int, 4>>& tri_map = tmp_tri_map;
    if (atri_map) {
        tri_map = *atri_map;
    } else {
        this->ComputeNeighbouringTriangleMap(tri_map);
    }

    std::vector<bool> marked_tris_flagged;
    marked_tris_flagged.resize(this->m_face_v_indices.size());
    for (auto i : marked_tris)
        marked_tris_flagged[i] = true;

    std::vector<int> new_marked_tris;

    for (auto t_0 : S) {
        // Insert-lepp-points

        std::list<int> mlist;
        mlist.push_back(t_0);

        while (!mlist.empty()) {
            //  find last triangle in ordered list
            auto t_N = mlist.back();

            //  find longest-edge neighbour
            int t_N1 = 0;
            double L_max = 0;
            int edge_N = 0;
            double L_e;
            for (int ie = 0; ie < 3; ++ie) {
                std::pair<int, int> ie_verts = this->GetTriangleEdgeIndexes(m_face_v_indices[t_N], ie, true);
                if (criterion)
                    L_e = criterion->ComputeLength(ie_verts.first, ie_verts.second, this);
                else
                    L_e = (this->m_vertices[ie_verts.first] - this->m_vertices[ie_verts.second]).Length();
                if (L_e > L_max) {
                    L_max = L_e;
                    edge_N = ie;
                    t_N1 = tri_map[t_N][1 + ie];  // neighbour triangle
                }
            }

            if (L_max < edge_maxlen) {
                //  GetLog() << "  already small triangle - pop it and break while " << "\n";
                mlist.pop_back();
                break;
            }

            // add longest-edge neighbour to the list
            mlist.push_back(t_N1);

            if (mlist.size() > 1000)
                throw ChException("overflow in ChTriangleMeshConnected::RefineMeshEdges");

            // if boundary edge: always terminal edge
            if (t_N1 == -1) {
                // split triangle edge
                if (L_max > edge_maxlen) {
                    // do edge split
                    int itA_1, itA_2, itB_1, itB_2;
                    SplitEdge(t_N, -1, edge_N, 0, itA_1, itA_2, itB_1, itB_2, tri_map, aux_data_double, aux_data_int,
                              aux_data_bool, aux_data_vect);

                    // prepare list of original triangles after split, for the next iteration of bisection
                    if (t_N < marked_tris_flagged.size() && marked_tris_flagged[t_N] == true) {
                        new_marked_tris.push_back(itA_1);
                        new_marked_tris.push_back(itA_2);
                    }
                }

                // remove from list
                mlist.pop_back();
                mlist.pop_back();

            } else {
                //  find longest-edge in neighboring triangle
                double T1_L_max = 0;
                int edge_N1 = 0;
                int t_shared = 0;
                for (int ie = 0; ie < 3; ++ie) {
                    std::pair<int, int> T1_ie_verts = this->GetTriangleEdgeIndexes(m_face_v_indices[t_N1], ie, true);
                    if (criterion)
                        L_e = criterion->ComputeLength(T1_ie_verts.first, T1_ie_verts.second, this);
                    else
                        L_e = (this->m_vertices[T1_ie_verts.first] - this->m_vertices[T1_ie_verts.second]).Length();
                    if (L_e > T1_L_max) {
                        T1_L_max = L_e;
                        edge_N1 = ie;
                        t_shared = tri_map[t_N1][1 + ie];  // neighbour triangle
                    }
                }
                // shared terminal edge (it is the longest edge in both triangles)
                if (t_shared == t_N) {
                    // split triangle edge
                    if (L_max > edge_maxlen) {
                        // do edge split
                        int itA_1, itA_2, itB_1, itB_2;
                        SplitEdge(t_N, t_N1, edge_N, edge_N1, itA_1, itA_2, itB_1, itB_2, tri_map, aux_data_double,
                                  aux_data_int, aux_data_bool, aux_data_vect);

                        // prepare list of original triangles after split, for the next iteration of bisection
                        if (t_N < marked_tris_flagged.size() && marked_tris_flagged[t_N] == true) {
                            new_marked_tris.push_back(itA_1);
                            new_marked_tris.push_back(itA_2);
                        }
                        if (t_N1 < marked_tris_flagged.size() && marked_tris_flagged[t_N1] == true) {
                            new_marked_tris.push_back(itB_1);
                            new_marked_tris.push_back(itB_2);
                        }
                    }

                    // remove from list
                    mlist.pop_back();
                    mlist.pop_back();
                }
            }
        }
    }
    marked_tris = new_marked_tris;
}